

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O3

void __thiscall Reader::splittokens(Reader *this)

{
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  ProcessedToken *pPVar1;
  LpSectionKeyword LVar2;
  bool bVar3;
  mapped_type *pmVar4;
  invalid_argument *this_01;
  LpSectionKeyword LVar5;
  ProcessedToken *pPVar6;
  _Base_ptr p_Var7;
  LpSectionKeyword LVar8;
  _Rb_tree_header *p_Var9;
  ProcessedToken *pPVar10;
  LpSectionKeyword currentsection;
  key_type local_3c;
  _Rb_tree_header *local_38;
  
  local_3c = NONE;
  pPVar10 = (this->processedtokens).
            super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar6 = (this->processedtokens).
           super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar10 != pPVar6) {
    this_00 = &this->sectiontokens;
    local_38 = &(this->sectiontokens)._M_t._M_impl.super__Rb_tree_header;
    LVar5 = NONE;
    LVar8 = NONE;
    bVar3 = false;
    do {
      if (pPVar10->type == SECID) {
        LVar2 = (pPVar10->field_1).keyword;
        if ((LVar8 != NONE) && (LVar8 != LVar2)) {
          if (!bVar3) {
            this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_01,"File not existent or illegal file format.");
            goto LAB_001dcddb;
          }
          pmVar4 = std::
                   map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   ::operator[](this_00,&local_3c);
          (pmVar4->second)._M_current = pPVar10;
          local_3c = NONE;
          pPVar6 = (this->processedtokens).
                   super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          LVar5 = NONE;
          bVar3 = false;
        }
        pPVar1 = pPVar10 + 1;
        if ((pPVar1 == pPVar6) || (pPVar1->type == SECID)) {
          if ((LVar5 == NONE) || (LVar5 == pPVar10[1].field_1.keyword)) {
            local_3c = NONE;
            LVar8 = NONE;
            LVar5 = NONE;
            if (bVar3) {
              this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (this_01,"File not existent or illegal file format.");
              goto LAB_001dcddb;
            }
          }
          else {
            if (!bVar3) {
              this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (this_01,"File not existent or illegal file format.");
              goto LAB_001dcddb;
            }
            pmVar4 = std::
                     map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                     ::operator[](this_00,&local_3c);
            (pmVar4->second)._M_current = pPVar10;
            local_3c = NONE;
            bVar3 = false;
            LVar8 = NONE;
            LVar5 = NONE;
          }
        }
        else if (LVar8 == LVar2) {
          LVar8 = LVar5;
          if (!(bool)(LVar5 == NONE ^ bVar3)) {
LAB_001dcd47:
            this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_01,"File not existent or illegal file format.");
            goto LAB_001dcddb;
          }
        }
        else {
          local_3c = (pPVar10->field_1).keyword;
          p_Var7 = (this->sectiontokens)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var9 = local_38;
          if (p_Var7 != (_Base_ptr)0x0) {
            do {
              if ((int)local_3c <= (int)*(size_t *)(p_Var7 + 1)) {
                p_Var9 = (_Rb_tree_header *)p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < (int)local_3c];
            } while (p_Var7 != (_Base_ptr)0x0);
            if ((p_Var9 != local_38) && ((int)p_Var9->_M_node_count <= (int)local_3c)) {
              this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (this_01,"File not existent or illegal file format.");
              goto LAB_001dcddb;
            }
          }
          if (bVar3) {
            this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument
                      (this_01,"File not existent or illegal file format.");
            goto LAB_001dcddb;
          }
          pmVar4 = std::
                   map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                   ::operator[](this_00,&local_3c);
          (pmVar4->first)._M_current = pPVar1;
          bVar3 = true;
          LVar8 = local_3c;
          LVar5 = local_3c;
          if (local_3c == NONE) goto LAB_001dcd47;
        }
      }
      pPVar10 = pPVar10 + 1;
      pPVar6 = (this->processedtokens).
               super__Vector_base<ProcessedToken,_std::allocator<ProcessedToken>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (pPVar10 != pPVar6);
    if (LVar5 != NONE) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_01,"File not existent or illegal file format.");
LAB_001dcddb:
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void Reader::splittokens() {
  LpSectionKeyword currentsection = LpSectionKeyword::NONE;

  bool debug_open_section = false;
  for (std::vector<ProcessedToken>::iterator it(processedtokens.begin());
       it != processedtokens.end(); ++it) {
    // Look for section keywords
    if (it->type != ProcessedTokenType::SECID) continue;
    // currentsection is initially LpSectionKeyword::NONE, so the
    // first section ID will be a new section type
    //
    // Only record change of section and check for repeated
    // section if the keyword is for a different section. Allows
    // repetition of Integers and General (cf #1299) for example
    const bool new_section_type = currentsection != it->keyword;
    if (new_section_type) {
      if (currentsection != LpSectionKeyword::NONE) {
        // Current section is non-trivial, so mark its end, using the
        // value of currentsection to indicate that there is no open
        // section
        lpassert(debug_open_section);
        sectiontokens[currentsection].second = it;
        debug_open_section = false;
        currentsection = LpSectionKeyword::NONE;
      }
    }
    std::vector<ProcessedToken>::iterator next = it;
    ++next;
    if (next == processedtokens.end() ||
        next->type == ProcessedTokenType::SECID) {
      // Reached the end of the tokens or the new section is empty
      //
      // currentsection will be LpSectionKeyword::NONE unless the
      // second of two sections of the same type is empty and the
      // next section is of a new type, in which case mark the end of
      // the current section
      if (currentsection != LpSectionKeyword::NONE &&
          currentsection != next->keyword) {
        lpassert(debug_open_section);
        sectiontokens[currentsection].second = it;
        debug_open_section = false;
      }
      currentsection = LpSectionKeyword::NONE;
      lpassert(!debug_open_section);
      continue;
    }
    // Next section is non-empty
    if (new_section_type) {
      // Section type change
      currentsection = it->keyword;
      // Make sure the new section type has not occurred previously
      lpassert(sectiontokens.count(currentsection) == 0);
      // Remember the beginning of the new section: its the token
      // following the current one
      lpassert(!debug_open_section);
      sectiontokens[currentsection].first = next;
      debug_open_section = true;
    }
    // Always ends with either an open section or a section type of
    // LpSectionKeyword::NONE
    lpassert(debug_open_section != (currentsection == LpSectionKeyword::NONE));
  }
  // Check that the last section has been closed
  lpassert(currentsection == LpSectionKeyword::NONE);
}